

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O0

double __thiscall chrono::viper::Viper::GetRoverMass(Viper *this)

{
  element_type *peVar1;
  __shared_ptr_access<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  __shared_ptr_access<chrono::viper::ViperUpperArm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_01;
  __shared_ptr_access<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_02;
  __shared_ptr_access<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  double dVar3;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  int i;
  undefined1 local_28 [24];
  double tot_mass;
  Viper *this_local;
  
  tot_mass = (double)this;
  std::__shared_ptr_access<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&this->m_chassis);
  ViperPart::GetBody((ViperPart *)local_28);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ChBody::GetMass((ChBody *)peVar1);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_28);
  local_28._16_8_ = p_Var2;
  for (local_48._16_4_ = 0; (int)local_48._16_4_ < 4; local_48._16_4_ = local_48._16_4_ + 1) {
    this_00 = (__shared_ptr_access<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::viper::ViperWheel>,_4UL>::operator[]
                           (&this->m_wheels,(long)(int)local_48._16_4_);
    std::__shared_ptr_access<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(this_00);
    ViperPart::GetBody((ViperPart *)local_48);
    peVar1 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
    dVar3 = ChBody::GetMass((ChBody *)peVar1);
    local_28._16_8_ = (double)local_28._16_8_ + dVar3;
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_48)
    ;
    this_01 = (__shared_ptr_access<chrono::viper::ViperUpperArm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::viper::ViperUpperArm>,_4UL>::operator[]
                           (&this->m_upper_arms,(long)(int)local_48._16_4_);
    std::__shared_ptr_access<chrono::viper::ViperUpperArm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(this_01);
    ViperPart::GetBody((ViperPart *)local_58);
    peVar1 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
    dVar3 = ChBody::GetMass((ChBody *)peVar1);
    local_28._16_8_ = (double)local_28._16_8_ + dVar3;
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_58)
    ;
    this_02 = (__shared_ptr_access<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::viper::ViperLowerArm>,_4UL>::operator[]
                           (&this->m_lower_arms,(long)(int)local_48._16_4_);
    std::__shared_ptr_access<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(this_02);
    ViperPart::GetBody((ViperPart *)local_68);
    peVar1 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
    dVar3 = ChBody::GetMass((ChBody *)peVar1);
    local_28._16_8_ = (double)local_28._16_8_ + dVar3;
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_68)
    ;
    this_03 = (__shared_ptr_access<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::viper::ViperUpright>,_4UL>::operator[]
                           (&this->m_uprights,(long)(int)local_48._16_4_);
    std::__shared_ptr_access<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(this_03);
    ViperPart::GetBody((ViperPart *)local_78);
    peVar1 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_78);
    dVar3 = ChBody::GetMass((ChBody *)peVar1);
    local_28._16_8_ = dVar3 + (double)local_28._16_8_;
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_78)
    ;
  }
  return (double)local_28._16_8_;
}

Assistant:

double Viper::GetRoverMass() const {
    double tot_mass = m_chassis->GetBody()->GetMass();
    for (int i = 0; i < 4; i++) {
        tot_mass += m_wheels[i]->GetBody()->GetMass();
        tot_mass += m_upper_arms[i]->GetBody()->GetMass();
        tot_mass += m_lower_arms[i]->GetBody()->GetMass();
        tot_mass += m_uprights[i]->GetBody()->GetMass();
    }
    return tot_mass;
}